

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
* __thiscall
nonius::execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::
run<std::chrono::_V2::system_clock>
          (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this,
          configuration *cfg,
          environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env)

{
  anon_class_72_2_633b781a __gen;
  back_insert_iterator<std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  bVar1;
  undefined8 in_RSI;
  Duration<std::chrono::_V2::system_clock> in_RDI;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  *times;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  *in_stack_fffffffffffffec8;
  size_type in_stack_fffffffffffffef8;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  *in_stack_ffffffffffffff00;
  repeater<nonius::now<std::chrono::_V2::system_clock>_> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  parameters *in_stack_ffffffffffffff18;
  undefined8 *puVar2;
  now<std::chrono::_V2::system_clock> local_22 [2];
  rep_conflict local_20;
  
  puVar2 = (undefined8 *)&stack0x00000008;
  local_20 = (rep_conflict)
             std::chrono::
             duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,double,std::ratio<1l,1000000000l>>
                       ((duration<double,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffec8)
  ;
  nonius::detail::repeat<nonius::now<std::chrono::_V2::system_clock>>(local_22);
  nonius::detail::
  run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>>
            (in_stack_ffffffffffffff18,in_RDI,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
            *)0x24df7d);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::reserve(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  bVar1 = std::
          back_inserter<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>
                    (in_stack_fffffffffffffec8);
  __gen.env.clock_resolution.outliers.high_severe = in_stack_ffffffffffffff10;
  __gen._0_32_ = *(undefined1 (*) [32])(puVar2 + 4);
  __gen.env.clock_resolution._28_4_ = in_stack_ffffffffffffff14;
  __gen.env.clock_cost.mean.__r = (rep)bVar1.container;
  __gen.env.clock_cost.outliers._0_8_ = in_RDI.__r;
  __gen.env.clock_cost.outliers._8_8_ = puVar2;
  __gen.env.clock_cost._24_8_ = in_RSI;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,int,nonius::execution_plan<std::chrono::duration<double,std::ratio<1l,1000000000l>>>::run<std::chrono::_V2::system_clock>(nonius::configuration,nonius::environment<std::chrono::duration<double,std::chrono::_V2::system_clock::period>>)const::_lambda()_1_>
            ((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)puVar2[1],(int)((ulong)*puVar2 >> 0x20),__gen);
  return (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
          *)in_RDI.__r;
}

Assistant:

std::vector<FloatDuration<Clock>> run(configuration cfg, environment<FloatDuration<Clock>> env) const {
            // warmup a bit
            detail::run_for_at_least<Clock>(params, chrono::duration_cast<nonius::Duration<Clock>>(warmup_time), warmup_iterations, detail::repeat(now<Clock>{}));

            std::vector<FloatDuration<Clock>> times;
            times.reserve(cfg.samples);
            std::generate_n(std::back_inserter(times), cfg.samples, [this, env]{
                    detail::chronometer_model<Clock> model;
                    detail::optimizer_barrier();
                    this->benchmark(chronometer(model, iterations_per_sample, params));
                    detail::optimizer_barrier();
                    auto sample_time = model.elapsed() - env.clock_cost.mean;
                    if(sample_time < FloatDuration<Clock>::zero()) sample_time = FloatDuration<Clock>::zero();
                    return sample_time / iterations_per_sample;
            });
            return times;
        }